

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O3

int mbedtls_pk_write_pubkey_pem(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  uint uVar1;
  size_t olen;
  uchar output_buf [2086];
  size_t local_850;
  uchar local_848 [2086];
  uchar auStack_22 [10];
  
  local_850 = 0;
  uVar1 = mbedtls_pk_write_pubkey_der(key,local_848,0x826);
  if (-1 < (int)uVar1) {
    uVar1 = mbedtls_pem_write_buffer
                      ("-----BEGIN PUBLIC KEY-----\n","-----END PUBLIC KEY-----\n",
                       auStack_22 + -(ulong)uVar1,(ulong)uVar1,buf,size,&local_850);
  }
  return uVar1;
}

Assistant:

int mbedtls_pk_write_pubkey_pem( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output_buf[PUB_DER_MAX_BYTES];
    size_t olen = 0;

    PK_VALIDATE_RET( key != NULL );
    PK_VALIDATE_RET( buf != NULL || size == 0 );

    if( ( ret = mbedtls_pk_write_pubkey_der( key, output_buf,
                                     sizeof(output_buf) ) ) < 0 )
    {
        return( ret );
    }

    if( ( ret = mbedtls_pem_write_buffer( PEM_BEGIN_PUBLIC_KEY, PEM_END_PUBLIC_KEY,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}